

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall HighsDomain::markPropagateCut(HighsDomain *this,Reason reason)

{
  _Map_pointer ppCVar1;
  reference this_00;
  reference this_01;
  long lVar2;
  uint uVar3;
  
  uVar3 = reason.type;
  if (0xfffffff8 < uVar3) {
    return;
  }
  ppCVar1 = (this->cutpoolpropagation).
            super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar2 = ((long)(this->cutpoolpropagation).
                 super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->cutpoolpropagation).
                 super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x71c71c71c71c71c7 +
          ((long)(this->cutpoolpropagation).
                 super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->cutpoolpropagation).
                 super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x71c71c71c71c71c7 +
          (((long)ppCVar1 -
            (long)(this->cutpoolpropagation).
                  super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppCVar1 == (_Map_pointer)0x0)) * 3;
  if ((int)uVar3 < (int)lVar2) {
    this_00 = std::
              _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
              ::operator[](&(this->cutpoolpropagation).
                            super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                            ._M_impl.super__Deque_impl_data._M_start,(long)(int)uVar3);
    CutpoolPropagation::markPropagateCut(this_00,reason.index);
    return;
  }
  this_01 = std::
            _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
            ::operator[](&(this->conflictPoolPropagation).
                          super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                          ._M_impl.super__Deque_impl_data._M_start,(int)uVar3 - lVar2);
  ConflictPoolPropagation::markPropagateConflict(this_01,reason.index);
  return;
}

Assistant:

void HighsDomain::markPropagateCut(Reason reason) {
  switch (reason.type) {
    case Reason::kUnknown:
    case Reason::kCliqueTable:
    case Reason::kBranching:
    case Reason::kModelRowLower:
    case Reason::kModelRowUpper:
    case Reason::kConflictingBounds:
    case Reason::kObjective:
      break;
    default:
      assert(reason.type >= 0 &&
             reason.type < HighsInt(cutpoolpropagation.size() +
                                    conflictPoolPropagation.size()));
      if (reason.type < (HighsInt)cutpoolpropagation.size())
        cutpoolpropagation[reason.type].markPropagateCut(reason.index);
      else
        conflictPoolPropagation[reason.type - cutpoolpropagation.size()]
            .markPropagateConflict(reason.index);
  }
}